

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O3

void __thiscall
btSpatialTransformationMatrix::transformInverse
          (btSpatialTransformationMatrix *this,btSymmetricSpatialDyad *inMat,
          btSymmetricSpatialDyad *outMat,eOutputOperation outOp)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btScalar bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float local_f8;
  float fStack_f4;
  float local_88;
  float fStack_84;
  
  fVar1 = (this->m_trnVec).m_floats[2];
  fVar16 = -fVar1;
  fVar21 = (this->m_trnVec).m_floats[0];
  fVar11 = (this->m_trnVec).m_floats[1];
  fVar20 = -fVar21;
  fVar22 = -fVar11;
  if (outOp == Subtract) {
    fVar2 = (inMat->m_topRightMat).m_el[0].m_floats[0];
    fVar9 = (inMat->m_topRightMat).m_el[0].m_floats[1];
    fVar14 = (inMat->m_topRightMat).m_el[0].m_floats[2];
    fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
    fVar8 = (inMat->m_topRightMat).m_el[1].m_floats[1];
    fVar19 = (inMat->m_topRightMat).m_el[1].m_floats[2];
    fVar17 = (inMat->m_topRightMat).m_el[2].m_floats[0];
    fVar15 = (inMat->m_topRightMat).m_el[2].m_floats[1];
    fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[2];
    fVar6 = (inMat->m_topLeftMat).m_el[0].m_floats[0] -
            (fVar22 * fVar14 + fVar2 * 0.0 + fVar1 * fVar9);
    fVar12 = (inMat->m_topLeftMat).m_el[0].m_floats[1] -
             (fVar21 * fVar14 + fVar16 * fVar2 + fVar9 * 0.0);
    fVar13 = (inMat->m_topLeftMat).m_el[0].m_floats[2] -
             (fVar14 * 0.0 + fVar2 * fVar11 + fVar9 * fVar20);
    fVar27 = (inMat->m_topLeftMat).m_el[1].m_floats[0] -
             (fVar22 * fVar19 + fVar7 * 0.0 + fVar1 * fVar8);
    fVar32 = (inMat->m_topLeftMat).m_el[1].m_floats[1] -
             (fVar21 * fVar19 + fVar16 * fVar7 + fVar8 * 0.0);
    fVar25 = (inMat->m_topLeftMat).m_el[1].m_floats[2] -
             (fVar19 * 0.0 + fVar7 * fVar11 + fVar8 * fVar20);
    fVar34 = (inMat->m_topLeftMat).m_el[2].m_floats[0] -
             (fVar22 * fVar18 + fVar17 * 0.0 + fVar1 * fVar15);
    fVar8 = (inMat->m_topLeftMat).m_el[2].m_floats[1] -
            (fVar21 * fVar18 + fVar16 * fVar17 + fVar15 * 0.0);
    fVar19 = (inMat->m_topLeftMat).m_el[2].m_floats[2] -
             (fVar18 * 0.0 + fVar17 * fVar11 + fVar15 * fVar20);
    fVar2 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar9 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar14 = (this->m_rotMat).m_el[2].m_floats[2];
    fVar33 = fVar34 * fVar14 + fVar6 * fVar9 + fVar2 * fVar27;
    fVar31 = fVar8 * fVar14 + fVar12 * fVar9 + fVar2 * fVar32;
    fVar30 = fVar19 * fVar14 + fVar13 * fVar9 + fVar2 * fVar25;
    fVar7 = (outMat->m_topLeftMat).m_el[2].m_floats[2];
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    fVar17 = (float)uVar3;
    uVar4 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    fVar23 = (float)uVar4;
    fVar24 = (float)((ulong)uVar4 >> 0x20);
    uVar4 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    fVar28 = (float)uVar4;
    fVar29 = (float)((ulong)uVar4 >> 0x20);
    fVar26 = fVar34 * fVar28 + fVar6 * fVar23 + fVar17 * fVar27;
    fVar35 = fVar8 * fVar28 + fVar12 * fVar23 + fVar17 * fVar32;
    fVar18 = (float)((ulong)uVar3 >> 0x20);
    fVar12 = fVar8 * fVar29 + fVar12 * fVar24 + fVar32 * fVar18;
    fVar15 = fVar19 * fVar28 + fVar13 * fVar23 + fVar17 * fVar25;
    fVar6 = fVar34 * fVar29 + fVar6 * fVar24 + fVar27 * fVar18;
    fVar27 = fVar29 * fVar19 + fVar24 * fVar13 + fVar18 * fVar25;
    fVar8 = (outMat->m_topLeftMat).m_el[0].m_floats[2];
    fVar19 = (outMat->m_topLeftMat).m_el[1].m_floats[2];
    uVar3 = *(undefined8 *)(outMat->m_topLeftMat).m_el[0].m_floats;
    *(ulong *)(outMat->m_topLeftMat).m_el[0].m_floats =
         CONCAT44((float)((ulong)uVar3 >> 0x20) -
                  (fVar15 * fVar29 + fVar26 * fVar24 + fVar35 * fVar18),
                  (float)uVar3 - (fVar15 * fVar28 + fVar26 * fVar23 + fVar35 * fVar17));
    (outMat->m_topLeftMat).m_el[0].m_floats[2] =
         fVar8 - (fVar9 * fVar26 + fVar2 * fVar35 + fVar14 * fVar15);
    (outMat->m_topLeftMat).m_el[0].m_floats[3] = 0.0;
    uVar3 = *(undefined8 *)(outMat->m_topLeftMat).m_el[1].m_floats;
    uVar4 = *(undefined8 *)(outMat->m_topLeftMat).m_el[2].m_floats;
    uVar5 = *(undefined8 *)(outMat->m_topRightMat).m_el[0].m_floats;
    *(ulong *)(outMat->m_topLeftMat).m_el[1].m_floats =
         CONCAT44((float)((ulong)uVar3 >> 0x20) -
                  (fVar27 * fVar29 + fVar6 * fVar24 + fVar12 * fVar18),
                  (float)uVar3 - (fVar27 * fVar28 + fVar6 * fVar23 + fVar12 * fVar17));
    (outMat->m_topLeftMat).m_el[1].m_floats[2] =
         fVar19 - (fVar14 * fVar27 + fVar9 * fVar6 + fVar2 * fVar12);
    (outMat->m_topLeftMat).m_el[1].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_topLeftMat).m_el[2].m_floats =
         CONCAT44((float)((ulong)uVar4 >> 0x20) -
                  (fVar30 * fVar29 + fVar33 * fVar24 + fVar31 * fVar18),
                  (float)uVar4 - (fVar30 * fVar28 + fVar33 * fVar23 + fVar31 * fVar17));
    (outMat->m_topLeftMat).m_el[2].m_floats[2] =
         fVar7 - (fVar14 * fVar30 + fVar9 * fVar33 + fVar2 * fVar31);
    (outMat->m_topLeftMat).m_el[2].m_floats[3] = 0.0;
    fVar2 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar9 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar14 = (this->m_rotMat).m_el[2].m_floats[2];
    fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
    fVar8 = (inMat->m_topRightMat).m_el[2].m_floats[0];
    fVar19 = (inMat->m_topRightMat).m_el[0].m_floats[0];
    fVar35 = fVar8 * fVar14 + fVar19 * fVar2 + fVar9 * fVar7;
    fVar17 = (inMat->m_topRightMat).m_el[1].m_floats[1];
    fVar15 = (inMat->m_topRightMat).m_el[0].m_floats[1];
    fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[1];
    fVar32 = fVar18 * fVar14 + fVar15 * fVar2 + fVar9 * fVar17;
    fVar6 = (inMat->m_topRightMat).m_el[1].m_floats[2];
    fVar12 = (inMat->m_topRightMat).m_el[0].m_floats[2];
    fVar27 = (inMat->m_topRightMat).m_el[2].m_floats[2];
    fVar34 = fVar27 * fVar14 + fVar12 * fVar2 + fVar9 * fVar6;
    fVar13 = (outMat->m_topRightMat).m_el[2].m_floats[2];
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    fVar25 = (float)uVar3;
    fVar26 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    fVar28 = (float)uVar3;
    uVar4 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    fVar23 = (float)uVar4;
    fVar24 = (float)((ulong)uVar4 >> 0x20);
    fVar30 = fVar8 * fVar23 + fVar19 * fVar28 + fVar25 * fVar7;
    fVar31 = fVar18 * fVar23 + fVar15 * fVar28 + fVar25 * fVar17;
    fVar29 = (float)((ulong)uVar3 >> 0x20);
    fVar18 = fVar18 * fVar24 + fVar15 * fVar29 + fVar17 * fVar26;
    fVar17 = fVar27 * fVar23 + fVar12 * fVar28 + fVar25 * fVar6;
    fVar15 = fVar8 * fVar24 + fVar19 * fVar29 + fVar7 * fVar26;
    fVar19 = fVar24 * fVar27 + fVar29 * fVar12 + fVar26 * fVar6;
    local_f8 = (float)uVar5;
    fStack_f4 = (float)((ulong)uVar5 >> 0x20);
    fVar7 = (outMat->m_topRightMat).m_el[0].m_floats[2];
    fVar8 = (outMat->m_topRightMat).m_el[1].m_floats[2];
    *(ulong *)(outMat->m_topRightMat).m_el[0].m_floats =
         CONCAT44(fStack_f4 - (fVar17 * fVar24 + fVar30 * fVar29 + fVar31 * fVar26),
                  local_f8 - (fVar17 * fVar23 + fVar30 * fVar28 + fVar31 * fVar25));
    (outMat->m_topRightMat).m_el[0].m_floats[2] =
         fVar7 - (fVar2 * fVar30 + fVar9 * fVar31 + fVar14 * fVar17);
    (outMat->m_topRightMat).m_el[0].m_floats[3] = 0.0;
    uVar3 = *(undefined8 *)(outMat->m_topRightMat).m_el[1].m_floats;
    uVar4 = *(undefined8 *)(outMat->m_topRightMat).m_el[2].m_floats;
    uVar5 = *(undefined8 *)(outMat->m_bottomLeftMat).m_el[0].m_floats;
    *(ulong *)(outMat->m_topRightMat).m_el[1].m_floats =
         CONCAT44((float)((ulong)uVar3 >> 0x20) -
                  (fVar19 * fVar24 + fVar15 * fVar29 + fVar18 * fVar26),
                  (float)uVar3 - (fVar19 * fVar23 + fVar15 * fVar28 + fVar18 * fVar25));
    (outMat->m_topRightMat).m_el[1].m_floats[2] =
         fVar8 - (fVar14 * fVar19 + fVar2 * fVar15 + fVar9 * fVar18);
    (outMat->m_topRightMat).m_el[1].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_topRightMat).m_el[2].m_floats =
         CONCAT44((float)((ulong)uVar4 >> 0x20) -
                  (fVar34 * fVar24 + fVar35 * fVar29 + fVar32 * fVar26),
                  (float)uVar4 - (fVar34 * fVar23 + fVar35 * fVar28 + fVar32 * fVar25));
    (outMat->m_topRightMat).m_el[2].m_floats[2] =
         fVar13 - (fVar14 * fVar34 + fVar2 * fVar35 + fVar9 * fVar32);
    (outMat->m_topRightMat).m_el[2].m_floats[3] = 0.0;
    fVar2 = (inMat->m_topRightMat).m_el[0].m_floats[0];
    fVar9 = (inMat->m_topRightMat).m_el[0].m_floats[1];
    fVar14 = (inMat->m_topRightMat).m_el[0].m_floats[2];
    fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
    fVar8 = (inMat->m_topRightMat).m_el[1].m_floats[1];
    fVar19 = (inMat->m_topRightMat).m_el[1].m_floats[2];
    fVar17 = (inMat->m_topRightMat).m_el[2].m_floats[1];
    fVar15 = (inMat->m_topRightMat).m_el[2].m_floats[0];
    fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[2];
    fVar6 = (inMat->m_topLeftMat).m_el[0].m_floats[0];
    fVar24 = fVar6 - (fVar22 * fVar14 + fVar2 * 0.0 + fVar1 * fVar9);
    fVar12 = (inMat->m_topLeftMat).m_el[0].m_floats[1];
    fVar13 = fVar12 - (fVar21 * fVar14 + fVar16 * fVar2 + fVar9 * 0.0);
    fVar27 = (inMat->m_topLeftMat).m_el[0].m_floats[2];
    fVar30 = fVar27 - (fVar14 * 0.0 + fVar2 * fVar11 + fVar9 * fVar20);
    fVar2 = (inMat->m_topLeftMat).m_el[1].m_floats[0];
    fVar25 = fVar2 - (fVar22 * fVar19 + fVar7 * 0.0 + fVar1 * fVar8);
    fVar9 = (inMat->m_topLeftMat).m_el[1].m_floats[1];
    fVar23 = fVar9 - (fVar21 * fVar19 + fVar16 * fVar7 + fVar8 * 0.0);
    fVar14 = (inMat->m_topLeftMat).m_el[1].m_floats[2];
    fVar34 = fVar14 - (fVar19 * 0.0 + fVar7 * fVar11 + fVar8 * fVar20);
    fVar7 = (inMat->m_topLeftMat).m_el[2].m_floats[0];
    fVar29 = fVar7 - (fVar22 * fVar18 + fVar15 * 0.0 + fVar1 * fVar17);
    fVar8 = (inMat->m_topLeftMat).m_el[2].m_floats[1];
    fVar31 = fVar8 - (fVar21 * fVar18 + fVar16 * fVar15 + fVar17 * 0.0);
    fVar19 = (inMat->m_topLeftMat).m_el[2].m_floats[2];
    fVar18 = fVar19 - (fVar18 * 0.0 + fVar15 * fVar11 + fVar17 * fVar20);
    fVar17 = (fVar29 * fVar11 + fVar24 * 0.0 + fVar25 * fVar16 +
             (inMat->m_bottomLeftMat).m_el[0].m_floats[0]) -
             (fVar22 * fVar7 + fVar6 * 0.0 + fVar1 * fVar2);
    fVar15 = (fVar31 * fVar11 + fVar13 * 0.0 + fVar23 * fVar16 +
             (inMat->m_bottomLeftMat).m_el[0].m_floats[1]) -
             (fVar21 * fVar7 + fVar16 * fVar6 + fVar2 * 0.0);
    fVar26 = (fVar18 * fVar11 + fVar30 * 0.0 + fVar34 * fVar16 +
             (inMat->m_bottomLeftMat).m_el[0].m_floats[2]) -
             (fVar7 * 0.0 + fVar6 * fVar11 + fVar2 * fVar20);
    fVar7 = (fVar29 * fVar20 + fVar24 * fVar1 + fVar25 * 0.0 +
            (inMat->m_bottomLeftMat).m_el[1].m_floats[0]) -
            (fVar22 * fVar8 + fVar12 * 0.0 + fVar1 * fVar9);
    fVar28 = (fVar31 * fVar20 + fVar13 * fVar1 + fVar23 * 0.0 +
             (inMat->m_bottomLeftMat).m_el[1].m_floats[1]) -
             (fVar21 * fVar8 + fVar16 * fVar12 + fVar9 * 0.0);
    fVar12 = (fVar18 * fVar20 + fVar30 * fVar1 + fVar34 * 0.0 +
             (inMat->m_bottomLeftMat).m_el[1].m_floats[2]) -
             (fVar8 * 0.0 + fVar12 * fVar11 + fVar9 * fVar20);
    fVar24 = (fVar29 * 0.0 + fVar24 * fVar22 + fVar25 * fVar21 +
             (inMat->m_bottomLeftMat).m_el[2].m_floats[0]) -
             (fVar22 * fVar19 + fVar27 * 0.0 + fVar1 * fVar14);
    fVar8 = (fVar31 * 0.0 + fVar13 * fVar22 + fVar23 * fVar21 +
            (inMat->m_bottomLeftMat).m_el[2].m_floats[1]) -
            (fVar21 * fVar19 + fVar16 * fVar27 + fVar14 * 0.0);
    fVar1 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar16 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar2 = (this->m_rotMat).m_el[2].m_floats[2];
    fVar21 = (fVar18 * 0.0 + fVar30 * fVar22 + fVar34 * fVar21 +
             (inMat->m_bottomLeftMat).m_el[2].m_floats[2]) -
             (fVar19 * 0.0 + fVar11 * fVar27 + fVar14 * fVar20);
    fVar25 = fVar24 * fVar2 + fVar17 * fVar1 + fVar16 * fVar7;
    fVar20 = fVar8 * fVar2 + fVar15 * fVar1 + fVar16 * fVar28;
    fVar23 = fVar21 * fVar2 + fVar26 * fVar1 + fVar16 * fVar12;
    bVar10 = (outMat->m_bottomLeftMat).m_el[2].m_floats[2] -
             (fVar2 * fVar23 + fVar1 * fVar25 + fVar16 * fVar20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    fVar14 = (float)uVar3;
    fVar19 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    fVar18 = (float)uVar3;
    fVar6 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    fVar22 = (float)uVar3;
    fVar9 = (float)((ulong)uVar3 >> 0x20);
    fVar27 = fVar24 * fVar22 + fVar17 * fVar18 + fVar14 * fVar7;
    fVar13 = fVar8 * fVar22 + fVar15 * fVar18 + fVar14 * fVar28;
    fVar15 = fVar8 * fVar9 + fVar15 * fVar6 + fVar28 * fVar19;
    fVar8 = fVar21 * fVar22 + fVar26 * fVar18 + fVar14 * fVar12;
    fVar17 = fVar24 * fVar9 + fVar17 * fVar6 + fVar7 * fVar19;
    fVar7 = fVar9 * fVar21 + fVar6 * fVar26 + fVar19 * fVar12;
    local_88 = (float)uVar5;
    fStack_84 = (float)((ulong)uVar5 >> 0x20);
    fVar21 = (outMat->m_bottomLeftMat).m_el[0].m_floats[2];
    fVar11 = (outMat->m_bottomLeftMat).m_el[1].m_floats[2];
    *(ulong *)(outMat->m_bottomLeftMat).m_el[0].m_floats =
         CONCAT44(fStack_84 - (fVar8 * fVar9 + fVar27 * fVar6 + fVar13 * fVar19),
                  local_88 - (fVar8 * fVar22 + fVar27 * fVar18 + fVar13 * fVar14));
    (outMat->m_bottomLeftMat).m_el[0].m_floats[2] =
         fVar21 - (fVar1 * fVar27 + fVar16 * fVar13 + fVar2 * fVar8);
    (outMat->m_bottomLeftMat).m_el[0].m_floats[3] = 0.0;
    uVar3 = *(undefined8 *)(outMat->m_bottomLeftMat).m_el[1].m_floats;
    uVar4 = *(undefined8 *)(outMat->m_bottomLeftMat).m_el[2].m_floats;
    *(ulong *)(outMat->m_bottomLeftMat).m_el[1].m_floats =
         CONCAT44((float)((ulong)uVar3 >> 0x20) - (fVar7 * fVar9 + fVar17 * fVar6 + fVar15 * fVar19)
                  ,(float)uVar3 - (fVar7 * fVar22 + fVar17 * fVar18 + fVar15 * fVar14));
    (outMat->m_bottomLeftMat).m_el[1].m_floats[2] =
         fVar11 - (fVar2 * fVar7 + fVar1 * fVar17 + fVar16 * fVar15);
    (outMat->m_bottomLeftMat).m_el[1].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_bottomLeftMat).m_el[2].m_floats =
         CONCAT44((float)((ulong)uVar4 >> 0x20) -
                  (fVar23 * fVar9 + fVar25 * fVar6 + fVar20 * fVar19),
                  (float)uVar4 - (fVar23 * fVar22 + fVar25 * fVar18 + fVar20 * fVar14));
  }
  else {
    if (outOp == Add) {
      fVar2 = (inMat->m_topRightMat).m_el[0].m_floats[0];
      fVar9 = (inMat->m_topRightMat).m_el[0].m_floats[1];
      fVar14 = (inMat->m_topRightMat).m_el[0].m_floats[2];
      fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
      fVar8 = (inMat->m_topRightMat).m_el[1].m_floats[1];
      fVar19 = (inMat->m_topRightMat).m_el[1].m_floats[2];
      fVar17 = (inMat->m_topRightMat).m_el[2].m_floats[0];
      fVar15 = (inMat->m_topRightMat).m_el[2].m_floats[1];
      fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[2];
      fVar6 = (inMat->m_topLeftMat).m_el[0].m_floats[0] -
              (fVar22 * fVar14 + fVar2 * 0.0 + fVar1 * fVar9);
      fVar28 = (inMat->m_topLeftMat).m_el[0].m_floats[1] -
               (fVar21 * fVar14 + fVar16 * fVar2 + fVar9 * 0.0);
      fVar12 = (inMat->m_topLeftMat).m_el[0].m_floats[2] -
               (fVar14 * 0.0 + fVar2 * fVar11 + fVar9 * fVar20);
      fVar34 = (inMat->m_topLeftMat).m_el[1].m_floats[0] -
               (fVar22 * fVar19 + fVar7 * 0.0 + fVar1 * fVar8);
      fVar29 = (inMat->m_topLeftMat).m_el[1].m_floats[1] -
               (fVar21 * fVar19 + fVar16 * fVar7 + fVar8 * 0.0);
      fVar30 = (inMat->m_topLeftMat).m_el[1].m_floats[2] -
               (fVar19 * 0.0 + fVar7 * fVar11 + fVar8 * fVar20);
      fVar8 = (inMat->m_topLeftMat).m_el[2].m_floats[0] -
              (fVar22 * fVar18 + fVar17 * 0.0 + fVar1 * fVar15);
      fVar19 = (inMat->m_topLeftMat).m_el[2].m_floats[1] -
               (fVar21 * fVar18 + fVar16 * fVar17 + fVar15 * 0.0);
      fVar7 = (inMat->m_topLeftMat).m_el[2].m_floats[2] -
              (fVar18 * 0.0 + fVar17 * fVar11 + fVar15 * fVar20);
      fVar2 = (this->m_rotMat).m_el[1].m_floats[2];
      fVar9 = (this->m_rotMat).m_el[0].m_floats[2];
      fVar14 = (this->m_rotMat).m_el[2].m_floats[2];
      fVar17 = fVar8 * fVar14 + fVar6 * fVar9 + fVar2 * fVar34;
      fVar27 = fVar19 * fVar14 + fVar28 * fVar9 + fVar2 * fVar29;
      fVar26 = fVar7 * fVar14 + fVar12 * fVar9 + fVar2 * fVar30;
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
      fVar15 = (float)uVar3;
      fVar18 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
      fVar23 = (float)uVar3;
      fVar25 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
      fVar31 = (float)uVar3;
      fVar35 = (float)((ulong)uVar3 >> 0x20);
      fVar24 = fVar8 * fVar31 + fVar6 * fVar23 + fVar15 * fVar34;
      fVar13 = fVar19 * fVar31 + fVar28 * fVar23 + fVar15 * fVar29;
      fVar29 = fVar19 * fVar35 + fVar28 * fVar25 + fVar29 * fVar18;
      fVar28 = fVar7 * fVar31 + fVar12 * fVar23 + fVar15 * fVar30;
      fVar6 = fVar8 * fVar35 + fVar6 * fVar25 + fVar34 * fVar18;
      fVar12 = fVar35 * fVar7 + fVar25 * fVar12 + fVar18 * fVar30;
      uVar3 = *(undefined8 *)(outMat->m_topLeftMat).m_el[0].m_floats;
      fVar7 = (outMat->m_topLeftMat).m_el[2].m_floats[2];
      fVar8 = (outMat->m_topLeftMat).m_el[0].m_floats[2];
      fVar19 = (outMat->m_topLeftMat).m_el[1].m_floats[2];
      *(ulong *)(outMat->m_topLeftMat).m_el[0].m_floats =
           CONCAT44((float)((ulong)uVar3 >> 0x20) +
                    fVar28 * fVar35 + fVar24 * fVar25 + fVar13 * fVar18,
                    (float)uVar3 + fVar28 * fVar31 + fVar24 * fVar23 + fVar13 * fVar15);
      (outMat->m_topLeftMat).m_el[0].m_floats[2] =
           fVar9 * fVar24 + fVar2 * fVar13 + fVar14 * fVar28 + fVar8;
      (outMat->m_topLeftMat).m_el[0].m_floats[3] = 0.0;
      uVar3 = *(undefined8 *)(outMat->m_topLeftMat).m_el[1].m_floats;
      uVar4 = *(undefined8 *)(outMat->m_topLeftMat).m_el[2].m_floats;
      uVar5 = *(undefined8 *)(outMat->m_topRightMat).m_el[0].m_floats;
      *(ulong *)(outMat->m_topLeftMat).m_el[1].m_floats =
           CONCAT44((float)((ulong)uVar3 >> 0x20) +
                    fVar12 * fVar35 + fVar6 * fVar25 + fVar29 * fVar18,
                    (float)uVar3 + fVar12 * fVar31 + fVar6 * fVar23 + fVar29 * fVar15);
      (outMat->m_topLeftMat).m_el[1].m_floats[2] =
           fVar14 * fVar12 + fVar9 * fVar6 + fVar2 * fVar29 + fVar19;
      (outMat->m_topLeftMat).m_el[1].m_floats[3] = 0.0;
      *(ulong *)(outMat->m_topLeftMat).m_el[2].m_floats =
           CONCAT44(fVar26 * fVar35 + fVar17 * fVar25 + fVar27 * fVar18 +
                    (float)((ulong)uVar4 >> 0x20),
                    fVar26 * fVar31 + fVar17 * fVar23 + fVar27 * fVar15 + (float)uVar4);
      (outMat->m_topLeftMat).m_el[2].m_floats[2] =
           fVar14 * fVar26 + fVar9 * fVar17 + fVar2 * fVar27 + fVar7;
      (outMat->m_topLeftMat).m_el[2].m_floats[3] = 0.0;
      fVar2 = (this->m_rotMat).m_el[0].m_floats[2];
      fVar9 = (this->m_rotMat).m_el[1].m_floats[2];
      fVar14 = (this->m_rotMat).m_el[2].m_floats[2];
      fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
      fVar8 = (inMat->m_topRightMat).m_el[2].m_floats[0];
      fVar19 = (inMat->m_topRightMat).m_el[0].m_floats[0];
      fVar30 = fVar8 * fVar14 + fVar19 * fVar2 + fVar9 * fVar7;
      fVar17 = (inMat->m_topRightMat).m_el[1].m_floats[1];
      fVar15 = (inMat->m_topRightMat).m_el[0].m_floats[1];
      fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[1];
      fVar13 = fVar18 * fVar14 + fVar15 * fVar2 + fVar9 * fVar17;
      fVar6 = (inMat->m_topRightMat).m_el[1].m_floats[2];
      fVar12 = (inMat->m_topRightMat).m_el[0].m_floats[2];
      fVar27 = (inMat->m_topRightMat).m_el[2].m_floats[2];
      fVar29 = fVar27 * fVar14 + fVar12 * fVar2 + fVar9 * fVar6;
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
      fVar25 = (float)uVar3;
      fVar26 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
      fVar23 = (float)uVar3;
      fVar24 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
      fVar34 = (float)uVar3;
      fVar31 = (float)((ulong)uVar3 >> 0x20);
      fVar28 = fVar8 * fVar34 + fVar19 * fVar23 + fVar25 * fVar7;
      fVar35 = fVar18 * fVar34 + fVar15 * fVar23 + fVar25 * fVar17;
      fVar32 = fVar18 * fVar31 + fVar15 * fVar24 + fVar17 * fVar26;
      fVar17 = fVar27 * fVar34 + fVar12 * fVar23 + fVar25 * fVar6;
      fVar18 = fVar8 * fVar31 + fVar19 * fVar24 + fVar7 * fVar26;
      fVar15 = fVar31 * fVar27 + fVar24 * fVar12 + fVar26 * fVar6;
      local_f8 = (float)uVar5;
      fStack_f4 = (float)((ulong)uVar5 >> 0x20);
      fVar7 = (outMat->m_topRightMat).m_el[2].m_floats[2];
      fVar8 = (outMat->m_topRightMat).m_el[0].m_floats[2];
      fVar19 = (outMat->m_topRightMat).m_el[1].m_floats[2];
      *(ulong *)(outMat->m_topRightMat).m_el[0].m_floats =
           CONCAT44(fVar17 * fVar31 + fVar28 * fVar24 + fVar35 * fVar26 + fStack_f4,
                    fVar17 * fVar34 + fVar28 * fVar23 + fVar35 * fVar25 + local_f8);
      (outMat->m_topRightMat).m_el[0].m_floats[2] =
           fVar2 * fVar28 + fVar9 * fVar35 + fVar14 * fVar17 + fVar8;
      (outMat->m_topRightMat).m_el[0].m_floats[3] = 0.0;
      uVar3 = *(undefined8 *)(outMat->m_topRightMat).m_el[1].m_floats;
      uVar4 = *(undefined8 *)(outMat->m_topRightMat).m_el[2].m_floats;
      uVar5 = *(undefined8 *)(outMat->m_bottomLeftMat).m_el[0].m_floats;
      *(ulong *)(outMat->m_topRightMat).m_el[1].m_floats =
           CONCAT44((float)((ulong)uVar3 >> 0x20) +
                    fVar15 * fVar31 + fVar18 * fVar24 + fVar32 * fVar26,
                    (float)uVar3 + fVar15 * fVar34 + fVar18 * fVar23 + fVar32 * fVar25);
      (outMat->m_topRightMat).m_el[1].m_floats[2] =
           fVar14 * fVar15 + fVar2 * fVar18 + fVar9 * fVar32 + fVar19;
      (outMat->m_topRightMat).m_el[1].m_floats[3] = 0.0;
      *(ulong *)(outMat->m_topRightMat).m_el[2].m_floats =
           CONCAT44(fVar29 * fVar31 + fVar30 * fVar24 + fVar13 * fVar26 +
                    (float)((ulong)uVar4 >> 0x20),
                    fVar29 * fVar34 + fVar30 * fVar23 + fVar13 * fVar25 + (float)uVar4);
      (outMat->m_topRightMat).m_el[2].m_floats[2] =
           fVar14 * fVar29 + fVar2 * fVar30 + fVar9 * fVar13 + fVar7;
      (outMat->m_topRightMat).m_el[2].m_floats[3] = 0.0;
      fVar2 = (inMat->m_topRightMat).m_el[0].m_floats[0];
      fVar9 = (inMat->m_topRightMat).m_el[0].m_floats[1];
      fVar14 = (inMat->m_topRightMat).m_el[0].m_floats[2];
      fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
      fVar8 = (inMat->m_topRightMat).m_el[1].m_floats[1];
      fVar19 = (inMat->m_topRightMat).m_el[1].m_floats[2];
      fVar17 = (inMat->m_topRightMat).m_el[2].m_floats[1];
      fVar15 = (inMat->m_topRightMat).m_el[2].m_floats[0];
      fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[2];
      fVar6 = (inMat->m_topLeftMat).m_el[0].m_floats[0];
      fVar25 = fVar6 - (fVar22 * fVar14 + fVar2 * 0.0 + fVar1 * fVar9);
      fVar12 = (inMat->m_topLeftMat).m_el[0].m_floats[1];
      fVar30 = fVar12 - (fVar21 * fVar14 + fVar16 * fVar2 + fVar9 * 0.0);
      fVar27 = (inMat->m_topLeftMat).m_el[0].m_floats[2];
      fVar29 = fVar27 - (fVar14 * 0.0 + fVar2 * fVar11 + fVar9 * fVar20);
      fVar2 = (inMat->m_topLeftMat).m_el[1].m_floats[0];
      fVar26 = fVar2 - (fVar22 * fVar19 + fVar7 * 0.0 + fVar1 * fVar8);
      fVar9 = (inMat->m_topLeftMat).m_el[1].m_floats[1];
      fVar13 = fVar9 - (fVar21 * fVar19 + fVar16 * fVar7 + fVar8 * 0.0);
      fVar14 = (inMat->m_topLeftMat).m_el[1].m_floats[2];
      fVar34 = fVar14 - (fVar19 * 0.0 + fVar7 * fVar11 + fVar8 * fVar20);
      fVar7 = (inMat->m_topLeftMat).m_el[2].m_floats[0];
      fVar28 = fVar7 - (fVar22 * fVar18 + fVar15 * 0.0 + fVar1 * fVar17);
      fVar8 = (inMat->m_topLeftMat).m_el[2].m_floats[1];
      fVar31 = fVar8 - (fVar21 * fVar18 + fVar16 * fVar15 + fVar17 * 0.0);
      fVar19 = (inMat->m_topLeftMat).m_el[2].m_floats[2];
      fVar23 = fVar19 - (fVar18 * 0.0 + fVar15 * fVar11 + fVar17 * fVar20);
      fVar24 = (fVar28 * fVar11 + fVar25 * 0.0 + fVar26 * fVar16 +
               (inMat->m_bottomLeftMat).m_el[0].m_floats[0]) -
               (fVar22 * fVar7 + fVar6 * 0.0 + fVar1 * fVar2);
      fVar17 = (fVar31 * fVar11 + fVar30 * 0.0 + fVar13 * fVar16 +
               (inMat->m_bottomLeftMat).m_el[0].m_floats[1]) -
               (fVar21 * fVar7 + fVar16 * fVar6 + fVar2 * 0.0);
      fVar7 = (fVar23 * fVar11 + fVar29 * 0.0 + fVar34 * fVar16 +
              (inMat->m_bottomLeftMat).m_el[0].m_floats[2]) -
              (fVar7 * 0.0 + fVar6 * fVar11 + fVar2 * fVar20);
      fVar15 = (fVar28 * fVar20 + fVar25 * fVar1 + fVar26 * 0.0 +
               (inMat->m_bottomLeftMat).m_el[1].m_floats[0]) -
               (fVar22 * fVar8 + fVar12 * 0.0 + fVar1 * fVar9);
      fVar18 = (fVar31 * fVar20 + fVar30 * fVar1 + fVar13 * 0.0 +
               (inMat->m_bottomLeftMat).m_el[1].m_floats[1]) -
               (fVar21 * fVar8 + fVar16 * fVar12 + fVar9 * 0.0);
      fVar6 = (fVar23 * fVar20 + fVar29 * fVar1 + fVar34 * 0.0 +
              (inMat->m_bottomLeftMat).m_el[1].m_floats[2]) -
              (fVar8 * 0.0 + fVar12 * fVar11 + fVar9 * fVar20);
      fVar28 = (fVar28 * 0.0 + fVar25 * fVar22 + fVar26 * fVar21 +
               (inMat->m_bottomLeftMat).m_el[2].m_floats[0]) -
               (fVar22 * fVar19 + fVar27 * 0.0 + fVar1 * fVar14);
      fVar30 = (fVar31 * 0.0 + fVar30 * fVar22 + fVar13 * fVar21 +
               (inMat->m_bottomLeftMat).m_el[2].m_floats[1]) -
               (fVar21 * fVar19 + fVar16 * fVar27 + fVar14 * 0.0);
      fVar1 = (this->m_rotMat).m_el[0].m_floats[2];
      fVar16 = (this->m_rotMat).m_el[1].m_floats[2];
      fVar2 = (this->m_rotMat).m_el[2].m_floats[2];
      fVar21 = (fVar23 * 0.0 + fVar29 * fVar22 + fVar34 * fVar21 +
               (inMat->m_bottomLeftMat).m_el[2].m_floats[2]) -
               (fVar19 * 0.0 + fVar11 * fVar27 + fVar14 * fVar20);
      fVar29 = fVar28 * fVar2 + fVar24 * fVar1 + fVar16 * fVar15;
      fVar22 = fVar30 * fVar2 + fVar17 * fVar1 + fVar16 * fVar18;
      fVar26 = fVar21 * fVar2 + fVar7 * fVar1 + fVar16 * fVar6;
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
      fVar9 = (float)uVar3;
      fVar8 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
      fVar27 = (float)uVar3;
      uVar4 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
      fVar19 = (float)uVar4;
      fVar12 = (float)((ulong)uVar4 >> 0x20);
      fVar23 = fVar28 * fVar19 + fVar24 * fVar27 + fVar9 * fVar15;
      fVar25 = fVar30 * fVar19 + fVar17 * fVar27 + fVar9 * fVar18;
      fVar13 = (float)((ulong)uVar3 >> 0x20);
      fVar18 = fVar30 * fVar12 + fVar17 * fVar13 + fVar18 * fVar8;
      fVar14 = fVar21 * fVar19 + fVar7 * fVar27 + fVar9 * fVar6;
      fVar17 = fVar28 * fVar12 + fVar24 * fVar13 + fVar15 * fVar8;
      fVar7 = fVar12 * fVar21 + fVar13 * fVar7 + fVar8 * fVar6;
      local_88 = (float)uVar5;
      fStack_84 = (float)((ulong)uVar5 >> 0x20);
      fVar21 = (outMat->m_bottomLeftMat).m_el[2].m_floats[2];
      fVar11 = (outMat->m_bottomLeftMat).m_el[0].m_floats[2];
      fVar20 = (outMat->m_bottomLeftMat).m_el[1].m_floats[2];
      *(ulong *)(outMat->m_bottomLeftMat).m_el[0].m_floats =
           CONCAT44(fVar14 * fVar12 + fVar23 * fVar13 + fVar25 * fVar8 + fStack_84,
                    fVar14 * fVar19 + fVar23 * fVar27 + fVar25 * fVar9 + local_88);
      (outMat->m_bottomLeftMat).m_el[0].m_floats[2] =
           fVar1 * fVar23 + fVar16 * fVar25 + fVar2 * fVar14 + fVar11;
      (outMat->m_bottomLeftMat).m_el[0].m_floats[3] = 0.0;
      uVar3 = *(undefined8 *)(outMat->m_bottomLeftMat).m_el[1].m_floats;
      uVar4 = *(undefined8 *)(outMat->m_bottomLeftMat).m_el[2].m_floats;
      *(ulong *)(outMat->m_bottomLeftMat).m_el[1].m_floats =
           CONCAT44((float)((ulong)uVar3 >> 0x20) +
                    fVar7 * fVar12 + fVar17 * fVar13 + fVar18 * fVar8,
                    (float)uVar3 + fVar7 * fVar19 + fVar17 * fVar27 + fVar18 * fVar9);
      (outMat->m_bottomLeftMat).m_el[1].m_floats[2] =
           fVar2 * fVar7 + fVar1 * fVar17 + fVar16 * fVar18 + fVar20;
      (outMat->m_bottomLeftMat).m_el[1].m_floats[3] = 0.0;
      *(ulong *)(outMat->m_bottomLeftMat).m_el[2].m_floats =
           CONCAT44(fVar26 * fVar12 + fVar29 * fVar13 + fVar22 * fVar8 +
                    (float)((ulong)uVar4 >> 0x20),
                    fVar26 * fVar19 + fVar29 * fVar27 + fVar22 * fVar9 + (float)uVar4);
      (outMat->m_bottomLeftMat).m_el[2].m_floats[2] =
           fVar2 * fVar26 + fVar1 * fVar29 + fVar16 * fVar22 + fVar21;
      goto LAB_001c0059;
    }
    if (outOp != None) {
      return;
    }
    fVar2 = (inMat->m_topRightMat).m_el[0].m_floats[0];
    fVar9 = (inMat->m_topRightMat).m_el[0].m_floats[1];
    fVar14 = (inMat->m_topRightMat).m_el[0].m_floats[2];
    fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
    fVar8 = (inMat->m_topRightMat).m_el[1].m_floats[1];
    fVar19 = (inMat->m_topRightMat).m_el[1].m_floats[2];
    fVar17 = (inMat->m_topRightMat).m_el[2].m_floats[0];
    fVar15 = (inMat->m_topRightMat).m_el[2].m_floats[1];
    fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[2];
    fVar12 = (inMat->m_topLeftMat).m_el[0].m_floats[0] -
             (fVar22 * fVar14 + fVar2 * 0.0 + fVar1 * fVar9);
    fVar27 = (inMat->m_topLeftMat).m_el[0].m_floats[1] -
             (fVar21 * fVar14 + fVar16 * fVar2 + fVar9 * 0.0);
    fVar34 = (inMat->m_topLeftMat).m_el[0].m_floats[2] -
             (fVar14 * 0.0 + fVar2 * fVar11 + fVar9 * fVar20);
    fVar6 = (inMat->m_topLeftMat).m_el[1].m_floats[0] -
            (fVar22 * fVar19 + fVar7 * 0.0 + fVar1 * fVar8);
    fVar30 = (inMat->m_topLeftMat).m_el[1].m_floats[1] -
             (fVar21 * fVar19 + fVar16 * fVar7 + fVar8 * 0.0);
    fVar7 = (inMat->m_topLeftMat).m_el[1].m_floats[2] -
            (fVar19 * 0.0 + fVar7 * fVar11 + fVar8 * fVar20);
    fVar26 = (inMat->m_topLeftMat).m_el[2].m_floats[0] -
             (fVar22 * fVar18 + fVar17 * 0.0 + fVar1 * fVar15);
    fVar29 = (inMat->m_topLeftMat).m_el[2].m_floats[1] -
             (fVar21 * fVar18 + fVar16 * fVar17 + fVar15 * 0.0);
    fVar24 = (inMat->m_topLeftMat).m_el[2].m_floats[2] -
             (fVar18 * 0.0 + fVar17 * fVar11 + fVar15 * fVar20);
    fVar2 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar9 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar14 = (this->m_rotMat).m_el[2].m_floats[2];
    fVar28 = fVar26 * fVar14 + fVar12 * fVar9 + fVar2 * fVar6;
    fVar8 = fVar29 * fVar14 + fVar27 * fVar9 + fVar2 * fVar30;
    fVar25 = fVar24 * fVar14 + fVar34 * fVar9 + fVar2 * fVar7;
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    fVar18 = (float)uVar3;
    fVar13 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    fVar31 = (float)uVar3;
    fVar35 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    fVar19 = (float)uVar3;
    fVar17 = (float)((ulong)uVar3 >> 0x20);
    fVar15 = fVar26 * fVar19 + fVar12 * fVar31 + fVar18 * fVar6;
    fVar23 = fVar29 * fVar19 + fVar27 * fVar31 + fVar18 * fVar30;
    fVar29 = fVar29 * fVar17 + fVar27 * fVar35 + fVar30 * fVar13;
    fVar27 = fVar24 * fVar19 + fVar34 * fVar31 + fVar18 * fVar7;
    fVar6 = fVar26 * fVar17 + fVar12 * fVar35 + fVar6 * fVar13;
    fVar7 = fVar17 * fVar24 + fVar35 * fVar34 + fVar13 * fVar7;
    *(ulong *)(outMat->m_topLeftMat).m_el[0].m_floats =
         CONCAT44(fVar27 * fVar17 + fVar15 * fVar35 + fVar23 * fVar13,
                  fVar27 * fVar19 + fVar15 * fVar31 + fVar23 * fVar18);
    (outMat->m_topLeftMat).m_el[0].m_floats[2] = fVar9 * fVar15 + fVar2 * fVar23 + fVar14 * fVar27;
    (outMat->m_topLeftMat).m_el[0].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_topLeftMat).m_el[1].m_floats =
         CONCAT44(fVar7 * fVar17 + fVar6 * fVar35 + fVar29 * fVar13,
                  fVar7 * fVar19 + fVar6 * fVar31 + fVar29 * fVar18);
    (outMat->m_topLeftMat).m_el[1].m_floats[2] = fVar14 * fVar7 + fVar9 * fVar6 + fVar2 * fVar29;
    (outMat->m_topLeftMat).m_el[1].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_topLeftMat).m_el[2].m_floats =
         CONCAT44(fVar25 * fVar17 + fVar28 * fVar35 + fVar8 * fVar13,
                  fVar25 * fVar19 + fVar28 * fVar31 + fVar8 * fVar18);
    (outMat->m_topLeftMat).m_el[2].m_floats[2] = fVar14 * fVar25 + fVar9 * fVar28 + fVar2 * fVar8;
    (outMat->m_topLeftMat).m_el[2].m_floats[3] = 0.0;
    fVar2 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar9 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar14 = (this->m_rotMat).m_el[2].m_floats[2];
    fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
    fVar8 = (inMat->m_topRightMat).m_el[2].m_floats[0];
    fVar19 = (inMat->m_topRightMat).m_el[0].m_floats[0];
    fVar17 = (inMat->m_topRightMat).m_el[1].m_floats[1];
    fVar31 = fVar8 * fVar14 + fVar19 * fVar2 + fVar9 * fVar7;
    fVar15 = (inMat->m_topRightMat).m_el[0].m_floats[1];
    fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[1];
    fVar35 = fVar18 * fVar14 + fVar15 * fVar2 + fVar9 * fVar17;
    fVar6 = (inMat->m_topRightMat).m_el[1].m_floats[2];
    fVar12 = (inMat->m_topRightMat).m_el[0].m_floats[2];
    fVar27 = (inMat->m_topRightMat).m_el[2].m_floats[2];
    fVar34 = fVar27 * fVar14 + fVar12 * fVar2 + fVar9 * fVar6;
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    fVar25 = (float)uVar3;
    fVar26 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    fVar13 = (float)uVar3;
    fVar23 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    fVar28 = (float)uVar3;
    fVar24 = fVar8 * fVar28 + fVar19 * fVar13 + fVar25 * fVar7;
    fVar30 = fVar18 * fVar28 + fVar15 * fVar13 + fVar25 * fVar17;
    fVar29 = (float)((ulong)uVar3 >> 0x20);
    fVar15 = fVar18 * fVar29 + fVar15 * fVar23 + fVar17 * fVar26;
    fVar17 = fVar27 * fVar28 + fVar12 * fVar13 + fVar25 * fVar6;
    fVar8 = fVar8 * fVar29 + fVar19 * fVar23 + fVar7 * fVar26;
    fVar7 = fVar29 * fVar27 + fVar23 * fVar12 + fVar26 * fVar6;
    *(ulong *)(outMat->m_topRightMat).m_el[0].m_floats =
         CONCAT44(fVar17 * fVar29 + fVar24 * fVar23 + fVar30 * fVar26,
                  fVar17 * fVar28 + fVar24 * fVar13 + fVar30 * fVar25);
    (outMat->m_topRightMat).m_el[0].m_floats[2] = fVar2 * fVar24 + fVar9 * fVar30 + fVar14 * fVar17;
    (outMat->m_topRightMat).m_el[0].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_topRightMat).m_el[1].m_floats =
         CONCAT44(fVar7 * fVar29 + fVar8 * fVar23 + fVar15 * fVar26,
                  fVar7 * fVar28 + fVar8 * fVar13 + fVar15 * fVar25);
    (outMat->m_topRightMat).m_el[1].m_floats[2] = fVar14 * fVar7 + fVar2 * fVar8 + fVar9 * fVar15;
    (outMat->m_topRightMat).m_el[1].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_topRightMat).m_el[2].m_floats =
         CONCAT44(fVar34 * fVar29 + fVar31 * fVar23 + fVar35 * fVar26,
                  fVar34 * fVar28 + fVar31 * fVar13 + fVar35 * fVar25);
    (outMat->m_topRightMat).m_el[2].m_floats[2] = fVar14 * fVar34 + fVar2 * fVar31 + fVar9 * fVar35;
    (outMat->m_topRightMat).m_el[2].m_floats[3] = 0.0;
    fVar2 = (inMat->m_topRightMat).m_el[0].m_floats[0];
    fVar9 = (inMat->m_topRightMat).m_el[0].m_floats[1];
    fVar14 = (inMat->m_topRightMat).m_el[0].m_floats[2];
    fVar7 = (inMat->m_topRightMat).m_el[1].m_floats[0];
    fVar8 = (inMat->m_topRightMat).m_el[1].m_floats[1];
    fVar19 = (inMat->m_topRightMat).m_el[1].m_floats[2];
    fVar17 = (inMat->m_topRightMat).m_el[2].m_floats[0];
    fVar15 = (inMat->m_topRightMat).m_el[2].m_floats[1];
    fVar18 = (inMat->m_topRightMat).m_el[2].m_floats[2];
    fVar6 = (inMat->m_topLeftMat).m_el[0].m_floats[0];
    fVar31 = fVar6 - (fVar22 * fVar14 + fVar2 * 0.0 + fVar1 * fVar9);
    fVar12 = (inMat->m_topLeftMat).m_el[0].m_floats[1];
    fVar29 = fVar12 - (fVar21 * fVar14 + fVar16 * fVar2 + fVar9 * 0.0);
    fVar27 = (inMat->m_topLeftMat).m_el[0].m_floats[2];
    fVar13 = fVar27 - (fVar14 * 0.0 + fVar2 * fVar11 + fVar9 * fVar20);
    fVar2 = (inMat->m_topLeftMat).m_el[1].m_floats[0];
    fVar26 = fVar2 - (fVar22 * fVar19 + fVar7 * 0.0 + fVar1 * fVar8);
    fVar9 = (inMat->m_topLeftMat).m_el[1].m_floats[1];
    fVar23 = fVar9 - (fVar21 * fVar19 + fVar16 * fVar7 + fVar8 * 0.0);
    fVar14 = (inMat->m_topLeftMat).m_el[1].m_floats[2];
    fVar30 = fVar14 - (fVar19 * 0.0 + fVar7 * fVar11 + fVar8 * fVar20);
    fVar7 = (inMat->m_topLeftMat).m_el[2].m_floats[0];
    fVar28 = fVar7 - (fVar22 * fVar18 + fVar17 * 0.0 + fVar1 * fVar15);
    fVar8 = (inMat->m_topLeftMat).m_el[2].m_floats[1];
    fVar34 = fVar8 - (fVar21 * fVar18 + fVar16 * fVar17 + fVar15 * 0.0);
    fVar19 = (inMat->m_topLeftMat).m_el[2].m_floats[2];
    fVar18 = fVar19 - (fVar18 * 0.0 + fVar17 * fVar11 + fVar15 * fVar20);
    fVar17 = (fVar28 * fVar11 + fVar31 * 0.0 + fVar26 * fVar16 +
             (inMat->m_bottomLeftMat).m_el[0].m_floats[0]) -
             (fVar22 * fVar7 + fVar6 * 0.0 + fVar1 * fVar2);
    fVar15 = (fVar34 * fVar11 + fVar29 * 0.0 + fVar23 * fVar16 +
             (inMat->m_bottomLeftMat).m_el[0].m_floats[1]) -
             (fVar21 * fVar7 + fVar16 * fVar6 + fVar2 * 0.0);
    fVar7 = (fVar18 * fVar11 + fVar13 * 0.0 + fVar30 * fVar16 +
            (inMat->m_bottomLeftMat).m_el[0].m_floats[2]) -
            (fVar7 * 0.0 + fVar6 * fVar11 + fVar2 * fVar20);
    fVar24 = (fVar28 * fVar20 + fVar31 * fVar1 + fVar26 * 0.0 +
             (inMat->m_bottomLeftMat).m_el[1].m_floats[0]) -
             (fVar22 * fVar8 + fVar12 * 0.0 + fVar1 * fVar9);
    fVar25 = (fVar34 * fVar20 + fVar29 * fVar1 + fVar23 * 0.0 +
             (inMat->m_bottomLeftMat).m_el[1].m_floats[1]) -
             (fVar21 * fVar8 + fVar16 * fVar12 + fVar9 * 0.0);
    fVar9 = (fVar18 * fVar20 + fVar13 * fVar1 + fVar30 * 0.0 +
            (inMat->m_bottomLeftMat).m_el[1].m_floats[2]) -
            (fVar8 * 0.0 + fVar12 * fVar11 + fVar9 * fVar20);
    fVar26 = (fVar28 * 0.0 + fVar31 * fVar22 + fVar26 * fVar21 +
             (inMat->m_bottomLeftMat).m_el[2].m_floats[0]) -
             (fVar22 * fVar19 + fVar27 * 0.0 + fVar1 * fVar14);
    fVar1 = (this->m_rotMat).m_el[0].m_floats[2];
    fVar28 = (fVar34 * 0.0 + fVar29 * fVar22 + fVar23 * fVar21 +
             (inMat->m_bottomLeftMat).m_el[2].m_floats[1]) -
             (fVar21 * fVar19 + fVar16 * fVar27 + fVar14 * 0.0);
    fVar16 = (this->m_rotMat).m_el[1].m_floats[2];
    fVar2 = (this->m_rotMat).m_el[2].m_floats[2];
    fVar19 = (fVar18 * 0.0 + fVar13 * fVar22 + fVar30 * fVar21 +
             (inMat->m_bottomLeftMat).m_el[2].m_floats[2]) -
             (fVar19 * 0.0 + fVar11 * fVar27 + fVar14 * fVar20);
    fVar13 = fVar26 * fVar2 + fVar17 * fVar1 + fVar16 * fVar24;
    fVar20 = fVar28 * fVar2 + fVar15 * fVar1 + fVar16 * fVar25;
    fVar27 = fVar19 * fVar2 + fVar7 * fVar1 + fVar16 * fVar9;
    bVar10 = fVar2 * fVar27 + fVar1 * fVar13 + fVar16 * fVar20;
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[1].m_floats;
    fVar22 = (float)uVar3;
    fVar8 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[0].m_floats;
    fVar21 = (float)uVar3;
    fVar11 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(this->m_rotMat).m_el[2].m_floats;
    fVar18 = (float)uVar3;
    fVar6 = (float)((ulong)uVar3 >> 0x20);
    fVar12 = fVar26 * fVar18 + fVar17 * fVar21 + fVar22 * fVar24;
    fVar23 = fVar28 * fVar18 + fVar15 * fVar21 + fVar22 * fVar25;
    fVar15 = fVar28 * fVar6 + fVar15 * fVar11 + fVar25 * fVar8;
    fVar14 = fVar19 * fVar18 + fVar7 * fVar21 + fVar22 * fVar9;
    fVar17 = fVar26 * fVar6 + fVar17 * fVar11 + fVar24 * fVar8;
    fVar9 = fVar6 * fVar19 + fVar11 * fVar7 + fVar8 * fVar9;
    *(ulong *)(outMat->m_bottomLeftMat).m_el[0].m_floats =
         CONCAT44(fVar14 * fVar6 + fVar12 * fVar11 + fVar23 * fVar8,
                  fVar14 * fVar18 + fVar12 * fVar21 + fVar23 * fVar22);
    (outMat->m_bottomLeftMat).m_el[0].m_floats[2] =
         fVar1 * fVar12 + fVar16 * fVar23 + fVar2 * fVar14;
    (outMat->m_bottomLeftMat).m_el[0].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_bottomLeftMat).m_el[1].m_floats =
         CONCAT44(fVar9 * fVar6 + fVar17 * fVar11 + fVar15 * fVar8,
                  fVar9 * fVar18 + fVar17 * fVar21 + fVar15 * fVar22);
    (outMat->m_bottomLeftMat).m_el[1].m_floats[2] = fVar2 * fVar9 + fVar1 * fVar17 + fVar16 * fVar15
    ;
    (outMat->m_bottomLeftMat).m_el[1].m_floats[3] = 0.0;
    *(ulong *)(outMat->m_bottomLeftMat).m_el[2].m_floats =
         CONCAT44(fVar27 * fVar6 + fVar13 * fVar11 + fVar20 * fVar8,
                  fVar27 * fVar18 + fVar13 * fVar21 + fVar20 * fVar22);
  }
  (outMat->m_bottomLeftMat).m_el[2].m_floats[2] = bVar10;
LAB_001c0059:
  (outMat->m_bottomLeftMat).m_el[2].m_floats[3] = 0.0;
  return;
}

Assistant:

void transformInverse(	const btSymmetricSpatialDyad &inMat,
							btSymmetricSpatialDyad &outMat,
							eOutputOperation outOp = None)
	{
		const btMatrix3x3 r_cross(	0, -m_trnVec[2], m_trnVec[1],
								m_trnVec[2], 0, -m_trnVec[0],
								-m_trnVec[1], m_trnVec[0], 0);


		if(outOp == None)
		{
			outMat.m_topLeftMat = m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat = m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat = m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
		else if(outOp == Add)
		{
			outMat.m_topLeftMat += m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat += m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat += m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
		else if(outOp == Subtract)
		{
			outMat.m_topLeftMat -= m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat -= m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat -= m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
	}